

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

ConflictData __thiscall Minisat::Solver::FindConflictLevel(Solver *this,CRef cind)

{
  uint *puVar1;
  ulong *puVar2;
  uint uVar3;
  VarData *pVVar4;
  uint *puVar5;
  ulong uVar6;
  Lit __tmp;
  ulong *puVar7;
  undefined4 uVar8;
  undefined8 unaff_RBX;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *pOVar15;
  ConflictData CVar16;
  Watcher local_38;
  
  pVVar4 = (this->vardata).data;
  puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  puVar1 = puVar5 + cind;
  uVar3 = puVar1[2];
  iVar14 = pVVar4[(int)uVar3 >> 1].level;
  if ((iVar14 == (this->trail_lim).sz) && (pVVar4[(int)puVar1[3] >> 1].level == iVar14)) {
    iVar13 = -1;
    uVar8 = 0;
  }
  else {
    puVar2 = (ulong *)(puVar5 + cind);
    puVar7 = puVar2 + 1;
    uVar9 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    iVar13 = 0;
    uVar12 = 0;
    for (uVar10 = 1; uVar8 = (undefined4)uVar9, uVar10 < *puVar2 >> 0x22; uVar10 = uVar10 + 1) {
      iVar11 = pVVar4[*(int *)((long)puVar7 + uVar10 * 4) >> 1].level;
      if (iVar14 < iVar11) {
        uVar12 = uVar10 & 0xffffffff;
        uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
        iVar13 = iVar14;
        iVar14 = iVar11;
      }
      else if ((iVar11 == iVar14) && (uVar6 = uVar9 & 1, uVar9 = uVar9 & 0xff, uVar6 != 0)) {
        uVar9 = 0;
      }
    }
    iVar11 = (int)uVar12;
    if (iVar11 != 0) {
      *(undefined4 *)puVar7 = *(undefined4 *)((long)puVar7 + (long)iVar11 * 4);
      *(uint *)((long)puVar7 + (long)iVar11 * 4) = uVar3;
      if (1 < iVar11) {
        pOVar15 = &this->watches_bin;
        if ((uint)((ulong)*(undefined8 *)puVar1 >> 0x22) != 2) {
          pOVar15 = &this->watches;
        }
        local_38.blocker.x = puVar1[3];
        local_38.cref = cind;
        remove<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
                  ((pOVar15->occs).data + ((long)(int)uVar3 ^ 1),&local_38);
        local_38.blocker.x = puVar1[3];
        vec<Minisat::Watcher>::push((pOVar15->occs).data + ((long)(int)puVar1[2] ^ 1),&local_38);
      }
    }
  }
  CVar16.secondHighestLevel = iVar13;
  CVar16.nHighestLevel = iVar14;
  CVar16._8_4_ = uVar8;
  return CVar16;
}

Assistant:

inline Solver::ConflictData Solver::FindConflictLevel(CRef cind)
{
    ConflictData data;
    Clause &conflCls = ca[cind];
    data.nHighestLevel = level(var(conflCls[0]));
    if (data.nHighestLevel == decisionLevel() && level(var(conflCls[1])) == decisionLevel()) {
        return data;
    }

    int highestId = 0;
    data.bOnlyOneLitFromHighest = true;
    data.secondHighestLevel = 0;
    // find the largest decision level in the clause
    for (int nLitId = 1; nLitId < conflCls.size(); ++nLitId) {
        int nLevel = level(var(conflCls[nLitId]));
        if (nLevel > data.nHighestLevel) {
            highestId = nLitId;
            data.secondHighestLevel = data.nHighestLevel;
            data.nHighestLevel = nLevel;
            data.bOnlyOneLitFromHighest = true;
        } else if (nLevel == data.nHighestLevel && data.bOnlyOneLitFromHighest == true) {
            data.bOnlyOneLitFromHighest = false;
        }
    }

    if (highestId != 0) {
        std::swap(conflCls[0], conflCls[highestId]);
        if (highestId > 1) {
            OccLists<Lit, vec<Watcher>, WatcherDeleted> &ws = conflCls.size() == 2 ? watches_bin : watches;
            // ws.smudge(~conflCls[highestId]);
            remove(ws[~conflCls[highestId]], Watcher(cind, conflCls[1]));
            ws[~conflCls[0]].push(Watcher(cind, conflCls[1]));
        }
    }

    return data;
}